

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  bool bVar1;
  cmMakefile *pcVar2;
  cmLocalGenerator *p;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  undefined1 local_de8 [8];
  RegularExpression currentRegex;
  string currentRegexString;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cf0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ce8;
  const_iterator itvIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string local_cc0;
  char *local_ca0;
  char *value_11;
  string ignoreTargetsRegexes;
  string local_c70;
  allocator local_c49;
  string local_c48;
  char *local_c28;
  char *value_10;
  string local_c18;
  allocator local_bf1;
  string local_bf0;
  char *local_bd0;
  char *value_9;
  string local_bc0;
  allocator local_b99;
  string local_b98;
  char *local_b78;
  char *value_8;
  string local_b68;
  allocator local_b41;
  string local_b40;
  char *local_b20;
  char *value_7;
  string local_b10;
  allocator local_ae9;
  string local_ae8;
  char *local_ac8;
  char *value_6;
  string local_ab8;
  allocator local_a91;
  string local_a90;
  char *local_a70;
  char *value_5;
  string local_a60;
  allocator local_a39;
  string local_a38;
  char *local_a18;
  char *value_4;
  string local_a08;
  char *local_9e8;
  char *value_3;
  string local_9d8;
  char *local_9b8;
  char *value_2;
  string local_9a8;
  char *local_988;
  char *value_1;
  string local_978;
  char *local_958;
  char *value;
  cmDebugger *local_948;
  char *inFileName;
  auto_ptr<cmLocalGenerator> lg;
  auto_ptr<cmMakefile> local_920;
  auto_ptr<cmMakefile> mf;
  cmGlobalGenerator ggi;
  allocator local_331;
  string local_330;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  cmake cm;
  char *fallbackSettingsFileName_local;
  char *settingsFileName_local;
  cmGraphVizWriter *this_local;
  
  cm.Debugger = (cmDebugger *)fallbackSettingsFileName;
  cmake::cmake((cmake *)local_2d8,RoleScript);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"",&local_2f9);
  cmake::SetHomeDirectory((cmake *)local_2d8,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"",&local_331);
  cmake::SetHomeOutputDirectory((cmake *)local_2d8,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&ggi.InstallTargetEnabled,(cmake *)local_2d8);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&ggi.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&mf,(cmake *)local_2d8);
  pcVar2 = (cmMakefile *)operator_new(0x760);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&lg,(cmake *)local_2d8);
  cmMakefile::cmMakefile(pcVar2,(cmGlobalGenerator *)&mf,(cmStateSnapshot *)&lg);
  ::cm::auto_ptr<cmMakefile>::auto_ptr(&local_920,pcVar2);
  pcVar2 = ::cm::auto_ptr<cmMakefile>::get(&local_920);
  p = cmGlobalGenerator::CreateLocalGenerator((cmGlobalGenerator *)&mf,pcVar2);
  ::cm::auto_ptr<cmLocalGenerator>::auto_ptr((auto_ptr<cmLocalGenerator> *)&inFileName,p);
  local_948 = (cmDebugger *)settingsFileName;
  bVar1 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar1) {
    local_948 = cm.Debugger;
    bVar1 = cmsys::SystemTools::FileExists((char *)cm.Debugger);
    if (!bVar1) {
      value._4_4_ = 1;
      goto LAB_0076aa83;
    }
  }
  pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
  bVar1 = cmMakefile::ReadListFile(pcVar2,(char *)local_948);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar3 = std::operator<<(poVar3,(char *)local_948);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_978,"GRAPHVIZ_GRAPH_TYPE",(allocator *)((long)&value_1 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_978);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_1 + 7));
    local_958 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,pcVar4);
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_9a8,"GRAPHVIZ_GRAPH_NAME",(allocator *)((long)&value_2 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_9a8);
    std::__cxx11::string::~string((string *)&local_9a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
    local_988 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphName,pcVar4);
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_9d8,"GRAPHVIZ_GRAPH_HEADER",(allocator *)((long)&value_3 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_9d8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_3 + 7));
    local_9b8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphHeader,pcVar4);
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a08,"GRAPHVIZ_NODE_PREFIX",(allocator *)((long)&value_4 + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_a08);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_4 + 7));
    local_9e8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphNodePrefix,pcVar4);
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a38,"GRAPHVIZ_EXECUTABLES",&local_a39);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_a38);
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator((allocator<char> *)&local_a39);
    local_a18 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a60,"GRAPHVIZ_EXECUTABLES",(allocator *)((long)&value_5 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_a60);
      this->GenerateForExecutables = bVar1;
      std::__cxx11::string::~string((string *)&local_a60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_5 + 7));
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a90,"GRAPHVIZ_STATIC_LIBS",&local_a91);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator((allocator<char> *)&local_a91);
    local_a70 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_ab8,"GRAPHVIZ_STATIC_LIBS",(allocator *)((long)&value_6 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_ab8);
      this->GenerateForStaticLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_ab8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_6 + 7));
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ae8,"GRAPHVIZ_SHARED_LIBS",&local_ae9);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_ae8);
    std::__cxx11::string::~string((string *)&local_ae8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
    local_ac8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b10,"GRAPHVIZ_SHARED_LIBS",(allocator *)((long)&value_7 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_b10);
      this->GenerateForSharedLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_b10);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_7 + 7));
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b40,"GRAPHVIZ_MODULE_LIBS",&local_b41);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_b40);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator((allocator<char> *)&local_b41);
    local_b20 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b68,"GRAPHVIZ_MODULE_LIBS",(allocator *)((long)&value_8 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_b68);
      this->GenerateForModuleLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_b68);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_8 + 7));
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b98,"GRAPHVIZ_EXTERNAL_LIBS",&local_b99);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_b98);
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator((allocator<char> *)&local_b99);
    local_b78 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_bc0,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)((long)&value_9 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_bc0);
      this->GenerateForExternals = bVar1;
      std::__cxx11::string::~string((string *)&local_bc0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_9 + 7));
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bf0,"GRAPHVIZ_GENERATE_PER_TARGET",&local_bf1);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_bf0);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
    local_bd0 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c18,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator *)((long)&value_10 + 7));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_c18);
      this->GeneratePerTarget = bVar1;
      std::__cxx11::string::~string((string *)&local_c18);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_10 + 7));
    }
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c48,"GRAPHVIZ_GENERATE_DEPENDERS",&local_c49);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_c48);
    std::__cxx11::string::~string((string *)&local_c48);
    std::allocator<char>::~allocator((allocator<char> *)&local_c49);
    local_c28 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c70,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
      bVar1 = cmMakefile::IsOn(pcVar2,&local_c70);
      this->GenerateDependers = bVar1;
      std::__cxx11::string::~string((string *)&local_c70);
      std::allocator<char>::~allocator
                ((allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string((string *)&value_11);
    pcVar2 = ::cm::auto_ptr<cmMakefile>::operator->(&local_920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_cc0,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_cc0);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_ca0 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&value_11,pcVar4);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&itvIt);
      cmSystemTools::ExpandListArgument
                ((string *)&value_11,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&itvIt,false);
      local_cf0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&itvIt);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_ce8,&local_cf0);
      while( true ) {
        currentRegexString.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&itvIt);
        bVar1 = __gnu_cxx::operator!=
                          (&local_ce8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&currentRegexString.field_2 + 8));
        if (!bVar1) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_ce8);
        std::__cxx11::string::string((string *)&currentRegex.searchstring,(string *)pbVar6);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_de8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_de8,pcVar4);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar3 = std::operator<<(poVar3,(string *)&currentRegex.searchstring);
          poVar3 = std::operator<<(poVar3,"\"");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(value_type *)local_de8);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_de8);
        std::__cxx11::string::~string((string *)&currentRegex.searchstring);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_ce8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&itvIt);
    }
    std::__cxx11::string::~string((string *)&value_11);
    value._4_4_ = 0;
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",(char *)local_948,(char *)0x0,(char *)0x0);
    value._4_4_ = 1;
  }
LAB_0076aa83:
  ::cm::auto_ptr<cmLocalGenerator>::~auto_ptr((auto_ptr<cmLocalGenerator> *)&inFileName);
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_920);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf);
  cmake::~cmake((cmake *)local_2d8);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&ggi, cm.GetCurrentSnapshot()));
  CM_AUTO_PTR<cmLocalGenerator> lg(ggi.CreateLocalGenerator(mf.get()));

  const char* inFileName = settingsFileName;

  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf->ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  {                                                                           \
    const char* value = mf->GetDefinition(cmakeDefinition);                   \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  {                                                                           \
    const char* value = mf->GetDefinition(cmakeDefinition);                   \
    if (value) {                                                              \
      (var) = mf->IsOn(cmakeDefinition);                                      \
    }                                                                         \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::vector<std::string>::const_iterator itvIt =
           ignoreTargetsRegExVector.begin();
         itvIt != ignoreTargetsRegExVector.end(); ++itvIt) {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str())) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
    }
  }
}